

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTPressureLPS25H.cpp
# Opt level: O3

bool __thiscall RTPressureLPS25H::pressureRead(RTPressureLPS25H *this,RTIMU_DATA *data)

{
  bool bVar1;
  RTFLOAT RVar2;
  uchar status;
  uchar rawData [3];
  byte local_1d;
  uint3 local_1c;
  
  data->pressureValid = false;
  data->temperatureValid = false;
  data->temperature = 0.0;
  data->pressure = 0.0;
  bVar1 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                            this->m_pressureAddr,'\'','\x01',&local_1d,
                            "Failed to read LPS25H status");
  if (!bVar1) {
    return false;
  }
  if ((local_1d & 2) == 0) {
LAB_0011e640:
    if ((local_1d & 1) == 0) {
      bVar1 = this->m_temperatureValid;
      RVar2 = this->m_temperature;
    }
    else {
      bVar1 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                                this->m_pressureAddr,0xab,'\x02',(uchar *)&local_1c,
                                "Failed to read LPS25H temperature");
      if (!bVar1) goto LAB_0011e6c0;
      RVar2 = (float)(int)(short)local_1c / 480.0 + 42.5;
      this->m_temperature = RVar2;
      this->m_temperatureValid = true;
      bVar1 = true;
    }
    data->pressureValid = this->m_pressureValid;
    data->pressure = this->m_pressure;
    data->temperatureValid = bVar1;
    data->temperature = RVar2;
    bVar1 = true;
  }
  else {
    bVar1 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                              this->m_pressureAddr,0xa8,'\x03',(uchar *)&local_1c,
                              "Failed to read LPS25H pressure");
    if (bVar1) {
      this->m_pressure = (float)local_1c * 0.00024414062;
      this->m_pressureValid = true;
      goto LAB_0011e640;
    }
LAB_0011e6c0:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool RTPressureLPS25H::pressureRead(RTIMU_DATA& data)
{
    unsigned char rawData[3];
    unsigned char status;

    data.pressureValid = false;
    data.temperatureValid = false;
    data.temperature = 0;
    data.pressure = 0;

    if (!m_settings->HALRead(m_pressureAddr, LPS25H_STATUS_REG, 1, &status, "Failed to read LPS25H status"))
        return false;

    if (status & 2) {
        if (!m_settings->HALRead(m_pressureAddr, LPS25H_PRESS_OUT_XL + 0x80, 3, rawData, "Failed to read LPS25H pressure"))
            return false;

        m_pressure = (RTFLOAT)((((unsigned int)rawData[2]) << 16) | (((unsigned int)rawData[1]) << 8) | (unsigned int)rawData[0]) / (RTFLOAT)4096;
        m_pressureValid = true;
    }
    if (status & 1) {
        if (!m_settings->HALRead(m_pressureAddr, LPS25H_TEMP_OUT_L + 0x80, 2, rawData, "Failed to read LPS25H temperature"))
            return false;

        m_temperature = (int16_t)((((unsigned int)rawData[1]) << 8) | (unsigned int)rawData[0]) / (RTFLOAT)480 + (RTFLOAT)42.5;
        m_temperatureValid = true;
    }

    data.pressureValid = m_pressureValid;
    data.pressure = m_pressure;
    data.temperatureValid = m_temperatureValid;
    data.temperature = m_temperature;

    return true;
}